

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall
olc::PixelGameEngine::Construct
          (PixelGameEngine *this,int32_t screen_w,int32_t screen_h,int32_t pixel_w,int32_t pixel_h,
          bool full_screen,bool vsync,bool cohesion)

{
  float local_60;
  olc local_5c [8];
  vf2d local_54;
  vi2d local_4c;
  vi2d local_44;
  vf2d local_3c;
  vi2d local_34;
  undefined1 local_2b;
  byte local_2a;
  byte local_29;
  int32_t local_28;
  bool cohesion_local;
  bool vsync_local;
  int32_t iStack_24;
  bool full_screen_local;
  int32_t pixel_h_local;
  int32_t pixel_w_local;
  int32_t screen_h_local;
  int32_t screen_w_local;
  PixelGameEngine *this_local;
  
  local_2a = vsync;
  local_2b = cohesion;
  this->bPixelCohesion = cohesion;
  local_29 = full_screen;
  local_28 = pixel_h;
  iStack_24 = pixel_w;
  pixel_h_local = screen_h;
  pixel_w_local = screen_w;
  _screen_h_local = this;
  v2d_generic<int>::v2d_generic(&local_34,screen_w,screen_h);
  this->vScreenSize = local_34;
  v2d_generic<float>::v2d_generic(&local_3c,1.0 / (float)pixel_w_local,1.0 / (float)pixel_h_local);
  this->vInvScreenSize = local_3c;
  v2d_generic<int>::v2d_generic(&local_44,iStack_24,local_28);
  this->vPixelSize = local_44;
  v2d_generic<int>::operator*(&local_4c,&this->vScreenSize);
  this->vWindowSize = local_4c;
  this->bFullScreen = (bool)(local_29 & 1);
  this->bEnableVSYNC = (bool)(local_2a & 1);
  local_60 = 2.0;
  operator/(local_5c,&local_60,&this->vScreenSize);
  v2d_generic::operator_cast_to_v2d_generic((v2d_generic *)&local_54);
  this->vPixel = local_54;
  if (((((this->vPixelSize).x < 1) || ((this->vPixelSize).y < 1)) || ((this->vScreenSize).x < 1)) ||
     ((this->vScreenSize).y < 1)) {
    this_local._4_4_ = FAIL;
  }
  else {
    this_local._4_4_ = OK;
  }
  return this_local._4_4_;
}

Assistant:

olc::rcode PixelGameEngine::Construct(int32_t screen_w, int32_t screen_h, int32_t pixel_w, int32_t pixel_h, bool full_screen, bool vsync, bool cohesion)
	{
		bPixelCohesion = cohesion;
		vScreenSize = { screen_w, screen_h };
		vInvScreenSize = { 1.0f / float(screen_w), 1.0f / float(screen_h) };
		vPixelSize = { pixel_w, pixel_h };
		vWindowSize = vScreenSize * vPixelSize;
		bFullScreen = full_screen;
		bEnableVSYNC = vsync;
		vPixel = 2.0f / vScreenSize;

		if (vPixelSize.x <= 0 || vPixelSize.y <= 0 || vScreenSize.x <= 0 || vScreenSize.y <= 0)
			return olc::FAIL;
		return olc::OK;
	}